

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall
despot::TagSHRPolicy::TagSHRPolicy(TagSHRPolicy *this,DSPOMDP *model,ParticleLowerBound *bound)

{
  BaseTag *pBVar1;
  
  despot::DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  *(undefined ***)this = &PTR__TagSHRPolicy_00121890;
  pBVar1 = (BaseTag *)(model + -0x38);
  if (model == (DSPOMDP *)0x0) {
    pBVar1 = (BaseTag *)0x0;
  }
  this->tag_model_ = pBVar1;
  despot::Floor::Floor(&this->floor_);
  Floor::operator=(&this->floor_,&this->tag_model_->floor_);
  return;
}

Assistant:

TagSHRPolicy(const DSPOMDP* model, ParticleLowerBound* bound) :
		DefaultPolicy(model, bound),
		tag_model_(static_cast<const BaseTag*>(model)) {
		floor_ = tag_model_->floor();
	}